

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O1

uchar * ZX7_compress(Optimal *optimal,uchar *input_data,size_t input_size,size_t *output_size)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  uchar *puVar4;
  uchar uVar5;
  ulong __size;
  uint uVar6;
  size_t sVar7;
  
  sVar7 = input_size - 1;
  __size = optimal[sVar7].bits + 0x19 >> 3;
  *output_size = __size;
  puVar4 = (uchar *)malloc(__size);
  output_data = puVar4;
  optimal[sVar7].bits = 0;
  while (sVar7 != 0) {
    uVar6 = optimal[sVar7].len;
    if (optimal[sVar7].len < 2) {
      uVar6 = 1;
    }
    optimal[sVar7 - uVar6].bits = sVar7;
    sVar7 = sVar7 - uVar6;
  }
  bit_mask = 0;
  output_index = 1;
  *puVar4 = *input_data;
  sVar7 = optimal->bits;
  do {
    if (sVar7 == 0) {
      write_bit(1);
      iVar3 = 0x10;
      do {
        if (bit_mask == 0) {
          bit_mask = 0x80;
          bit_index = output_index;
          puVar4 = output_data + output_index;
          output_index = output_index + 1;
          *puVar4 = '\0';
        }
        bit_mask = bit_mask >> 1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      write_bit(1);
      return output_data;
    }
    if (optimal[sVar7].len == 0) {
      if (bit_mask == 0) {
        bit_mask = 0x80;
        bit_index = output_index;
        puVar4 = output_data + output_index;
        output_index = output_index + 1;
        *puVar4 = '\0';
      }
      bit_mask = bit_mask >> 1;
      uVar5 = input_data[sVar7];
LAB_001061f5:
      puVar4 = output_data + output_index;
      output_index = output_index + 1;
      *puVar4 = uVar5;
    }
    else {
      write_bit(1);
      write_elias_gamma(optimal[sVar7].len + -1);
      iVar3 = optimal[sVar7].offset;
      if (iVar3 < 0x81) {
        uVar5 = (char)iVar3 + 0xff;
        goto LAB_001061f5;
      }
      pbVar1 = output_data + output_index;
      output_index = output_index + 1;
      *pbVar1 = (byte)(iVar3 - 0x81U) | 0x80;
      uVar6 = 0x400;
      do {
        write_bit(uVar6 & iVar3 - 0x81U);
        bVar2 = 0xff < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar2);
    }
    sVar7 = optimal[sVar7].bits;
  } while( true );
}

Assistant:

unsigned char *ZX7_compress(Optimal *optimal, unsigned char *input_data, size_t input_size, size_t *output_size) {
    size_t input_index;
    size_t input_prev;
    int offset1;
    int mask;
    int i;

    /* calculate and allocate output buffer */
    input_index = input_size-1;
    *output_size = (optimal[input_index].bits+18+7)/8;
    output_data = (unsigned char *)MemMalloc(*output_size);

    /* un-reverse optimal sequence */
    optimal[input_index].bits = 0;
    while (input_index > 0) {
        input_prev = input_index - (optimal[input_index].len > 0 ? optimal[input_index].len : 1);
        optimal[input_prev].bits = input_index;
        input_index = input_prev;
    }

    output_index = 0;
    bit_mask = 0;

    /* first byte is always literal */
    write_byte(input_data[0]);

    /* process remaining bytes */
    while ((input_index = optimal[input_index].bits) > 0) {
        if (optimal[input_index].len == 0) {

            /* literal indicator */
            write_bit(0);

            /* literal value */
            write_byte(input_data[input_index]);

        } else {

            /* sequence indicator */
            write_bit(1);

            /* sequence length */
            write_elias_gamma(optimal[input_index].len-1);

            /* sequence offset */
            offset1 = optimal[input_index].offset-1;
            if (offset1 < 128) {
                write_byte(offset1);
            } else {
                offset1 -= 128;
                write_byte((offset1 & 127) | 128);
                for (mask = 1024; mask > 127; mask >>= 1) {
                    write_bit(offset1 & mask);
                }
            }
        }
    }

    /* sequence indicator */
    write_bit(1);

    /* end marker > MAX_LEN */
    for (i = 0; i < 16; i++) {
        write_bit(0);
    }
    write_bit(1);

    return output_data;
}